

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep.cpp
# Opt level: O2

void anon_unknown.dwarf_3813e::err_cb(exr_const_context_t f,int code,char *msg)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"err_cb ERROR ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,code);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,msg);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void
err_cb (exr_const_context_t f, int code, const char* msg)
{
    std::cerr << "err_cb ERROR " << code << ": " << msg << std::endl;
}